

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall
Am_Value_List_Data::Insert
          (Am_Value_List_Data *this,Am_Value *value,Am_List_Item *current,
          Am_Insert_Position position)

{
  Am_List_Item *this_00;
  Am_List_Item *item;
  Am_Insert_Position position_local;
  Am_List_Item *current_local;
  Am_Value *value_local;
  Am_Value_List_Data *this_local;
  
  *(short *)&(this->super_Am_Wrapper).field_0xc = *(short *)&(this->super_Am_Wrapper).field_0xc + 1;
  this_00 = (Am_List_Item *)operator_new(0x20);
  Am_List_Item::Am_List_Item(this_00);
  Am_List_Item::operator=(this_00,value);
  if (current == (Am_List_Item *)0x0) {
    if (position == Am_BEFORE) {
      this_00->next = (Am_List_Item *)0x0;
      this_00->prev = this->tail;
      if (this->tail == (Am_List_Item *)0x0) {
        this->head = this_00;
      }
      else {
        this->tail->next = this_00;
      }
      this->tail = this_00;
    }
    else {
      this_00->prev = (Am_List_Item *)0x0;
      this_00->next = this->head;
      if (this->head == (Am_List_Item *)0x0) {
        this->tail = this_00;
      }
      else {
        this->head->prev = this_00;
      }
      this->head = this_00;
    }
  }
  else if (position == Am_BEFORE) {
    this_00->prev = current->prev;
    this_00->next = current;
    current->prev = this_00;
    if (this_00->prev == (Am_List_Item *)0x0) {
      this->head = this_00;
    }
    else {
      this_00->prev->next = this_00;
    }
  }
  else {
    this_00->next = current->next;
    this_00->prev = current;
    current->next = this_00;
    if (this_00->next == (Am_List_Item *)0x0) {
      this->tail = this_00;
    }
    else {
      this_00->next->prev = this_00;
    }
  }
  return;
}

Assistant:

void
Am_Value_List_Data::Insert(const Am_Value &value, Am_List_Item *current,
                           Am_Insert_Position position)
{
  ++number;
  Am_List_Item *item = new Am_List_Item;
  *item = value;
  if (current) {
    if (position == Am_BEFORE) {
      item->prev = current->prev;
      item->next = current;
      current->prev = item;
      if (item->prev)
        item->prev->next = item;
      else
        head = item;
    } else {
      item->next = current->next;
      item->prev = current;
      current->next = item;
      if (item->next)
        item->next->prev = item;
      else
        tail = item;
    }
  } else {
    if (position == Am_BEFORE) {
      item->next = nullptr;
      item->prev = tail;
      if (tail)
        tail->next = item;
      else
        head = item;
      tail = item;
    } else {
      item->prev = nullptr;
      item->next = head;
      if (head)
        head->prev = item;
      else
        tail = item;
      head = item;
    }
  }
}